

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_tools_hom.cxx
# Opt level: O0

void __thiscall level_tools::reconstruct_hom(level_tools *this)

{
  xr_level_hom *pxVar1;
  xr_mesh_builder *this_00;
  xr_object *this_01;
  string *this_02;
  uint32_t *puVar2;
  xr_object *object;
  hom_surface_factory surface_factory;
  level_aux_mesh *mesh;
  level_tools *this_local;
  
  pxVar1 = xray_re::xr_level::hom(this->m_level);
  if (pxVar1 != (xr_level_hom *)0x0) {
    xray_re::msg("building %s","HOM object");
    this_00 = (xr_mesh_builder *)operator_new(600);
    level_aux_mesh::level_aux_mesh((level_aux_mesh *)this_00);
    pxVar1 = xray_re::xr_level::hom(this->m_level);
    level_aux_mesh::build((level_aux_mesh *)this_00,pxVar1);
    xray_re::xr_level::clear_hom(this->m_level);
    hom_surface_factory::hom_surface_factory((hom_surface_factory *)&object);
    this_01 = (xr_object *)operator_new(400);
    xray_re::xr_object::xr_object(this_01,(xr_surface_factory *)&object);
    xray_re::xr_mesh_builder::commit(this_00,this_01);
    this_02 = xray_re::xr_mesh::name_abi_cxx11_((xr_mesh *)this_00);
    std::__cxx11::string::operator=((string *)this_02,"occShape");
    (*(this_01->super_xr_surface_factory)._vptr_xr_surface_factory[6])();
    puVar2 = xray_re::xr_object::flags(this_01);
    *puVar2 = 8;
    save_scene_object(this,this_01,"occ");
    if (this_01 != (xr_object *)0x0) {
      (*(this_01->super_xr_surface_factory)._vptr_xr_surface_factory[1])();
    }
    hom_surface_factory::~hom_surface_factory((hom_surface_factory *)&object);
  }
  return;
}

Assistant:

void level_tools::reconstruct_hom()
{
	if (m_level->hom() == 0)
		return;
	msg("building %s", "HOM object");

	level_aux_mesh* mesh = new level_aux_mesh;
	mesh->build(*m_level->hom());
	m_level->clear_hom();

	hom_surface_factory surface_factory;
	xr_object* object = new xr_object(&surface_factory);
	mesh->commit(*object);
	mesh->name() = "occShape";
	object->denominate_surfaces();
	object->flags() = EOF_HOM;
	save_scene_object(object, "occ");
	delete object;
}